

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModSqrt_test.cpp
# Opt level: O3

void __thiscall MOD_SQRT_SmallValues_Test::TestBody(MOD_SQRT_SmallValues_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer *this_01;
  uint uVar1;
  int iVar2;
  bool bVar3;
  int extraout_EAX;
  undefined1 auVar4 [8];
  char *message;
  undefined8 *puVar5;
  uint uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db_00;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> primes;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> sqrtable;
  AssertHelper local_50;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  AssertionResult gtest_ar;
  
  eratosthenes_sieve((vector<int,_std::allocator<int>_> *)local_b0,300);
  if (local_b0 !=
      (undefined1  [8])
      primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start)
  {
    this_01 = &primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    this_00 = &gtest_ar.message_;
    auVar4 = local_b0;
    do {
      uVar1 = *(uint *)&((__node_base_ptr)auVar4)->_M_nxt;
      primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&sqrtable._M_h._M_rehash_policy._M_next_resize;
      sqrtable._M_h._M_buckets = (__buckets_ptr)0x1;
      sqrtable._M_h._M_bucket_count = 0;
      sqrtable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      sqrtable._M_h._M_element_count._0_4_ = 0x3f800000;
      sqrtable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      sqrtable._M_h._M_rehash_policy._4_4_ = 0;
      sqrtable._M_h._M_rehash_policy._M_next_resize = 0;
      sqrtable._M_h._M_single_bucket = (__node_base_ptr)auVar4;
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          gtest_ar.message_.ptr_._0_4_ = uVar6 * uVar6;
          local_48 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)this_01;
          std::
          _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                    ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_01,this_00,&local_48);
          uVar6 = uVar6 + 1;
          puVar5 = (undefined8 *)sqrtable._M_h._M_bucket_count;
          uVar7 = extraout_XMM0_Da;
          uVar8 = extraout_XMM0_Db;
        } while (uVar1 != uVar6);
        for (; puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
          iVar2 = *(int *)(puVar5 + 1);
          sqrt((double)CONCAT44(uVar8,uVar7));
          gtest_ar.message_.ptr_._0_4_ = (uint)(extraout_EAX * extraout_EAX) % uVar1;
          local_50.data_._0_4_ = iVar2 % (int)uVar1;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_48,"(s*s)%p","a % p",(int *)this_00,(int *)&local_50);
          if (local_48._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)this_00);
            message = "";
            if (gtest_ar._0_8_ != 0) {
              message = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/kactl/number-theory/ModSqrt_test.cpp"
                       ,0xc,message);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)this_00);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if (((CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) &&
                (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
               ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
                (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                             (uint)gtest_ar.message_.ptr_) + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar7 = extraout_XMM0_Da_00;
          uVar8 = extraout_XMM0_Db_00;
        }
      }
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)this_01);
      auVar4 = (undefined1  [8])((long)&(sqrtable._M_h._M_single_bucket)->_M_nxt + 4);
    } while (auVar4 != (undefined1  [8])
                       primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  if (local_b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b0);
  }
  return;
}

Assistant:

TEST(MOD_SQRT, SmallValues) {
    auto primes = eratosthenes_sieve(300);
    for(int p : primes) {
        unordered_set<int> sqrtable;
        rep(a,0,p) sqrtable.insert(a*a);
        for(int a : sqrtable) {
            int s = sqrt(a, p);
            EXPECT_EQ((s*s)%p, a % p);
        }
    }
}